

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  ImGuiID IVar1;
  char *pcVar2;
  size_t sVar3;
  
  (this->DC).MenuColumns.OffsetLabel = 0;
  (this->DC).MenuColumns.OffsetShortcut = 0;
  (this->DC).MenuColumns.OffsetMark = 0;
  (this->DC).MenuColumns.Widths[0] = 0;
  *(undefined8 *)((this->DC).MenuColumns.Widths + 1) = 0;
  (this->DC).MenuColumns.TotalWidth = 0;
  (this->DC).MenuColumns.NextTotalWidth = 0;
  (this->DC).MenuColumns.Spacing = 0;
  (this->DC).MenuColumns.OffsetIcon = 0;
  (this->DC).MenuColumns.OffsetLabel = 0;
  (this->DC).MenuColumns.OffsetShortcut = 0;
  (this->DrawListInst)._Splitter._Current = 0;
  (this->DrawListInst)._Splitter._Count = 0;
  (this->DrawListInst)._Splitter._Channels.Size = 0;
  (this->DrawListInst)._Splitter._Channels.Capacity = 0;
  (this->DrawListInst)._Splitter._Channels.Data = (ImDrawChannel *)0x0;
  memset(&this->DrawListInst,0,200);
  memset(this,0,0x3b8);
  pcVar2 = ImStrdup(name);
  this->Name = pcVar2;
  sVar3 = strlen(name);
  this->NameBufLen = (int)sVar3 + 1;
  IVar1 = ImHashStr(name,0,0);
  this->ID = IVar1;
  ImVector<unsigned_int>::push_back(&this->IDStack,&this->ID);
  IVar1 = GetID(this,"#MOVE",(char *)0x0);
  this->MoveId = IVar1;
  (this->ScrollTarget).x = 3.4028235e+38;
  (this->ScrollTarget).y = 3.4028235e+38;
  (this->ScrollTargetCenterRatio).x = 0.5;
  (this->ScrollTargetCenterRatio).y = 0.5;
  this->AutoFitFramesX = -1;
  this->AutoFitFramesY = -1;
  this->AutoPosLastDirection = -1;
  *(uint *)&this->field_0xbc = (uint)(byte)this->field_0xbf << 0x18 | 0xf0f0f;
  (this->SetWindowPosVal).x = 3.4028235e+38;
  (this->SetWindowPosVal).y = 3.4028235e+38;
  (this->SetWindowPosPivot).x = 3.4028235e+38;
  (this->SetWindowPosPivot).y = 3.4028235e+38;
  this->LastFrameActive = -1;
  this->LastTimeActive = -1.0;
  this->FontWindowScale = 1.0;
  this->SettingsOffset = -1;
  this->DrawList = &this->DrawListInst;
  (this->DrawListInst)._Data = &context->DrawListSharedData;
  (this->DrawListInst)._OwnerName = this->Name;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name) : DrawListInst(NULL)
{
    memset(this, 0, sizeof(*this));
    Name = ImStrdup(name);
    NameBufLen = (int)strlen(name) + 1;
    ID = ImHashStr(name);
    IDStack.push_back(ID);
    MoveId = GetID("#MOVE");
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoPosLastDirection = ImGuiDir_None;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);
    LastFrameActive = -1;
    LastTimeActive = -1.0f;
    FontWindowScale = 1.0f;
    SettingsOffset = -1;
    DrawList = &DrawListInst;
    DrawList->_Data = &context->DrawListSharedData;
    DrawList->_OwnerName = Name;
}